

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_Curve * __thiscall ON_Extrusion::IsoCurve(ON_Extrusion *this,int dir,double c)

{
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dVector T_00;
  ON_3dVector T_01;
  bool bVar1;
  int iVar2;
  ON_LineCurve *this_00;
  undefined4 extraout_var;
  ulong uVar3;
  ON_NurbsCurve *pOVar4;
  double dVar5;
  double dVar6;
  ON_3dVector *local_258;
  ON_3dVector *local_250;
  ON_NurbsCurve *nurbs_curve;
  double s0;
  double s1;
  double local_220;
  double local_218;
  ON_3dPoint local_210;
  ON_LineCurve *local_1f8;
  ON_LineCurve *line_curve;
  ON_3dPoint P;
  ON_Curve *isocurve;
  ON_3dPoint local_1a0;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  ON_3dPoint local_158;
  undefined1 local_140 [8];
  ON_Xform xform1;
  ON_Xform xform0;
  ON_3dVector T;
  double c_local;
  int dir_local;
  ON_Extrusion *this_local;
  
  if (this->m_profile == (ON_Curve *)0x0) {
    this_local = (ON_Extrusion *)0x0;
  }
  else {
    c_local._4_4_ = dir;
    if ((this->m_bTransposed & 1U) != 0) {
      c_local._4_4_ = 1 - dir;
    }
    ON_Line::Tangent((ON_3dVector *)(xform0.m_xform[3] + 3),&this->m_path);
    ON_Xform::ON_Xform((ON_Xform *)(xform1.m_xform[3] + 3));
    ON_Xform::ON_Xform((ON_Xform *)local_140);
    ON_Line::PointAt(&local_158,&this->m_path,(this->m_t).m_t[0]);
    local_170 = xform0.m_xform[3][3];
    local_188 = (this->m_up).x;
    local_180 = (this->m_up).y;
    local_178 = (this->m_up).z;
    if ((this->m_bHaveN[0] & 1U) == 0) {
      local_250 = (ON_3dVector *)0x0;
    }
    else {
      local_250 = this->m_N;
    }
    P_00.y = local_158.y;
    P_00.x = local_158.x;
    P_00.z = local_158.z;
    T_00.y = T.x;
    T_00.x = xform0.m_xform[3][3];
    T_00.z = T.y;
    bVar1 = ON_GetEndCapTransformation
                      (P_00,T_00,this->m_up,local_250,(ON_Xform *)(xform1.m_xform[3] + 3),
                       (ON_Xform *)0x0,(ON_Xform *)0x0);
    if (bVar1) {
      ON_Line::PointAt(&local_1a0,&this->m_path,(this->m_t).m_t[1]);
      if ((this->m_bHaveN[1] & 1U) == 0) {
        local_258 = (ON_3dVector *)0x0;
      }
      else {
        local_258 = this->m_N + 1;
      }
      P_01.y = local_1a0.y;
      P_01.x = local_1a0.x;
      P_01.z = local_1a0.z;
      T_01.y = T.x;
      T_01.x = xform0.m_xform[3][3];
      T_01.z = T.y;
      bVar1 = ON_GetEndCapTransformation
                        (P_01,T_01,this->m_up,local_258,(ON_Xform *)local_140,(ON_Xform *)0x0,
                         (ON_Xform *)0x0);
      if (bVar1) {
        P.z = 0.0;
        if (c_local._4_4_ == 1) {
          ON_Curve::PointAt((ON_3dPoint *)&line_curve,this->m_profile,c);
          this_00 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve::ON_LineCurve(this_00);
          (this_00->m_t).m_t[0] = (this->m_path_domain).m_t[0];
          (this_00->m_t).m_t[1] = (this->m_path_domain).m_t[1];
          this_00->m_dim = 3;
          local_1f8 = this_00;
          ON_Xform::operator*(&local_210,(ON_Xform *)(xform1.m_xform[3] + 3),
                              (ON_3dPoint *)&line_curve);
          (local_1f8->m_line).from.x = local_210.x;
          (local_1f8->m_line).from.y = local_210.y;
          (local_1f8->m_line).from.z = local_210.z;
          ON_Xform::operator*((ON_3dPoint *)&s1,(ON_Xform *)local_140,(ON_3dPoint *)&line_curve);
          (local_1f8->m_line).to.x = s1;
          (local_1f8->m_line).to.y = local_220;
          (local_1f8->m_line).to.z = local_218;
          P.z = (double)local_1f8;
        }
        else if (c_local._4_4_ == 0) {
          dVar5 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,c);
          dVar6 = 1.0 - dVar5;
          local_140 = (undefined1  [8])(dVar6 * xform1.m_xform[3][3] + dVar5 * (double)local_140);
          xform1.m_xform[0][0] = dVar6 * xform0.m_xform[0][0] + dVar5 * xform1.m_xform[0][0];
          xform1.m_xform[0][1] = dVar6 * xform0.m_xform[0][1] + dVar5 * xform1.m_xform[0][1];
          xform1.m_xform[0][2] = dVar6 * xform0.m_xform[0][2] + dVar5 * xform1.m_xform[0][2];
          xform1.m_xform[0][3] = dVar6 * xform0.m_xform[0][3] + dVar5 * xform1.m_xform[0][3];
          xform1.m_xform[1][0] = dVar6 * xform0.m_xform[1][0] + dVar5 * xform1.m_xform[1][0];
          xform1.m_xform[1][1] = dVar6 * xform0.m_xform[1][1] + dVar5 * xform1.m_xform[1][1];
          xform1.m_xform[1][2] = dVar6 * xform0.m_xform[1][2] + dVar5 * xform1.m_xform[1][2];
          xform1.m_xform[1][3] = dVar6 * xform0.m_xform[1][3] + dVar5 * xform1.m_xform[1][3];
          xform1.m_xform[2][0] = dVar6 * xform0.m_xform[2][0] + dVar5 * xform1.m_xform[2][0];
          xform1.m_xform[2][1] = dVar6 * xform0.m_xform[2][1] + dVar5 * xform1.m_xform[2][1];
          xform1.m_xform[2][2] = dVar6 * xform0.m_xform[2][2] + dVar5 * xform1.m_xform[2][2];
          xform1.m_xform[2][3] = dVar6 * xform0.m_xform[2][3] + dVar5 * xform1.m_xform[2][3];
          xform1.m_xform[3][0] = dVar6 * xform0.m_xform[3][0] + dVar5 * xform1.m_xform[3][0];
          xform1.m_xform[3][1] = dVar6 * xform0.m_xform[3][1] + dVar5 * xform1.m_xform[3][1];
          xform1.m_xform[3][2] = dVar6 * xform0.m_xform[3][2] + dVar5 * xform1.m_xform[3][2];
          iVar2 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
          P.z = (double)CONCAT44(extraout_var,iVar2);
          if ((long *)P.z != (long *)0x0) {
            (**(code **)(*(long *)P.z + 0x140))(P.z,3);
            uVar3 = (**(code **)(*(long *)P.z + 0xe0))(P.z,local_140);
            if ((uVar3 & 1) == 0) {
              pOVar4 = ON_Curve::NurbsCurve
                                 ((ON_Curve *)P.z,(ON_NurbsCurve *)0x0,0.0,(ON_Interval *)0x0);
              if (P.z != 0.0) {
                (**(code **)(*(long *)P.z + 0x20))();
              }
              P.z = (double)pOVar4;
              if (pOVar4 != (ON_NurbsCurve *)0x0) {
                (*(pOVar4->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                          (pOVar4,local_140);
              }
            }
          }
        }
        this_local = (ON_Extrusion *)P.z;
      }
      else {
        this_local = (ON_Extrusion *)0x0;
      }
    }
    else {
      this_local = (ON_Extrusion *)0x0;
    }
  }
  return (ON_Curve *)this_local;
}

Assistant:

ON_Curve* ON_Extrusion::IsoCurve(
       int dir,
       double c
       ) const
{
  // dir 0 first parameter varies and second parameter is constant
  //       e.g., point on IsoCurve(0,c) at t is srf(t,c)
  //     1 first parameter is constant and second parameter varies
  //       e.g., point on IsoCurve(1,c) at t is srf(c,t)

  if ( !m_profile )
    return 0;

  if ( m_bTransposed )
    dir = 1-dir;
  const ON_3dVector T = m_path.Tangent();

  ON_Xform xform0, xform1;
  if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[0]),T,m_up,m_bHaveN[0]?&m_N[0]:0,xform0,0,0) )
    return 0;
  if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[1]),T,m_up,m_bHaveN[1]?&m_N[1]:0,xform1,0,0) )
    return 0;

  ON_Curve*  isocurve = 0;
  if ( 1 == dir )
  {
    ON_3dPoint P = m_profile->PointAt(c);
    ON_LineCurve* line_curve = new ON_LineCurve();
    line_curve->m_t = m_path_domain;
    line_curve->m_dim = 3;
    line_curve->m_line.from = xform0*P;
    line_curve->m_line.to = xform1*P;
    isocurve = line_curve;
  }
  else if ( 0 == dir )
  {
    double s1 = m_path_domain.NormalizedParameterAt(c);
    const double s0 = 1.0-s1;
    xform1.m_xform[0][0] = s0*xform0.m_xform[0][0] + s1*xform1.m_xform[0][0];
    xform1.m_xform[0][1] = s0*xform0.m_xform[0][1] + s1*xform1.m_xform[0][1];
    xform1.m_xform[0][2] = s0*xform0.m_xform[0][2] + s1*xform1.m_xform[0][2];
    xform1.m_xform[0][3] = s0*xform0.m_xform[0][3] + s1*xform1.m_xform[0][3];

    xform1.m_xform[1][0] = s0*xform0.m_xform[1][0] + s1*xform1.m_xform[1][0];
    xform1.m_xform[1][1] = s0*xform0.m_xform[1][1] + s1*xform1.m_xform[1][1];
    xform1.m_xform[1][2] = s0*xform0.m_xform[1][2] + s1*xform1.m_xform[1][2];
    xform1.m_xform[1][3] = s0*xform0.m_xform[1][3] + s1*xform1.m_xform[1][3];

    xform1.m_xform[2][0] = s0*xform0.m_xform[2][0] + s1*xform1.m_xform[2][0];
    xform1.m_xform[2][1] = s0*xform0.m_xform[2][1] + s1*xform1.m_xform[2][1];
    xform1.m_xform[2][2] = s0*xform0.m_xform[2][2] + s1*xform1.m_xform[2][2];
    xform1.m_xform[2][3] = s0*xform0.m_xform[2][3] + s1*xform1.m_xform[2][3];

    xform1.m_xform[3][0] = s0*xform0.m_xform[3][0] + s1*xform1.m_xform[3][0];
    xform1.m_xform[3][1] = s0*xform0.m_xform[3][1] + s1*xform1.m_xform[3][1];
    xform1.m_xform[3][2] = s0*xform0.m_xform[3][2] + s1*xform1.m_xform[3][2];
    xform1.m_xform[3][3] = s0*xform0.m_xform[3][3] + s1*xform1.m_xform[3][3];

    isocurve = m_profile->DuplicateCurve();
    if ( isocurve )
    {
      isocurve->ChangeDimension(3);
      if ( !isocurve->Transform(xform1) )
      {
        // isocurve is probably a circle
        ON_NurbsCurve* nurbs_curve = isocurve->NurbsCurve();
        delete isocurve;
        isocurve = nurbs_curve;
        nurbs_curve = 0;
        if ( isocurve )
          isocurve->Transform(xform1);
      }
    }
  }

  return isocurve;
}